

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O3

bool slang::ast::AssertionInstanceExpression::checkAssertionArg
               (PropertyExprSyntax *propExpr,AssertionPortSymbol *formal,ASTContext *context,
               ActualArg *result,bool isRecursiveProp)

{
  bool bVar1;
  int iVar2;
  type expr;
  int *piVar3;
  Type *this;
  Type *pTVar4;
  Expression *pEVar5;
  undefined4 extraout_var_00;
  ValueSymbol *this_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  Diagnostic *pDVar6;
  socklen_t extraout_EDX;
  socklen_t extraout_EDX_00;
  socklen_t __len;
  int *piVar7;
  DiagCode code;
  SimpleSequenceExprSyntax *simpSeq;
  int *piVar8;
  SourceRange SVar9;
  ASTContext ctx;
  Expression *local_80;
  ASTContext local_78;
  AssertionPortSymbol *local_38;
  undefined4 extraout_var;
  
  if ((propExpr->super_SyntaxNode).kind == SimplePropertyExpr) {
    piVar8 = *(int **)&propExpr[1].super_SyntaxNode;
    if ((*piVar8 != 0x1b1) || (*(long *)(piVar8 + 8) != 0)) goto LAB_004ca2a1;
    piVar7 = *(int **)(piVar8 + 6);
  }
  else {
    piVar8 = (int *)0x0;
LAB_004ca2a1:
    piVar7 = (int *)0x0;
  }
  local_78.assertionInstance = context->assertionInstance;
  local_78.scope.ptr = (context->scope).ptr;
  local_78.lookupIndex = context->lookupIndex;
  local_78._12_4_ = *(undefined4 *)&context->field_0xc;
  local_78.flags.m_bits = (context->flags).m_bits;
  local_78.instanceOrProc = context->instanceOrProc;
  local_78.firstTempVar = context->firstTempVar;
  local_78.randomizeDetails = context->randomizeDetails;
  if ((isRecursiveProp) &&
     ((formal->direction).super__Optional_base<slang::ast::ArgumentDirection,_true,_true>._M_payload
      .super__Optional_payload_base<slang::ast::ArgumentDirection>._M_engaged == false)) {
    piVar3 = piVar7;
    if (piVar7 != (int *)0x0) {
      for (; *piVar3 == 0x167; piVar3 = *(int **)(piVar3 + 10)) {
      }
      if (*piVar3 == 0xe5) goto LAB_004ca2fc;
    }
    local_78.flags.m_bits = local_78.flags.m_bits | 0x800000;
  }
LAB_004ca2fc:
  local_38 = formal;
  this = DeclaredType::getType(&formal->declaredType);
  pTVar4 = this->canonical;
  __len = extraout_EDX;
  if (pTVar4 == (Type *)0x0) {
    Type::resolveCanonical(this);
    pTVar4 = this->canonical;
    __len = extraout_EDX_00;
  }
  switch((pTVar4->super_Symbol).kind) {
  case EventType:
    iVar2 = TimingControl::bind((int)propExpr,(sockaddr *)&local_78,__len);
    pEVar5 = (Expression *)CONCAT44(extraout_var,iVar2);
    local_80 = pEVar5;
    std::
    variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
    ::operator=((variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
                 *)result,(TimingControl **)&local_80);
    goto LAB_004ca4f9;
  default:
    if (piVar7 == (int *)0x0) {
      SVar9 = slang::syntax::SyntaxNode::sourceRange(&propExpr->super_SyntaxNode);
      pDVar6 = ASTContext::addDiag(&local_78,(DiagCode)0x20007,SVar9);
LAB_004ca54a:
      ast::operator<<(pDVar6,this);
      return false;
    }
    iVar2 = Expression::bind((int)piVar7,(sockaddr *)&local_78,0);
    pEVar5 = (Expression *)CONCAT44(extraout_var_00,iVar2);
    bVar1 = Expression::bad(pEVar5);
    if (bVar1) {
      return false;
    }
    bVar1 = Type::isCastCompatible(this,(pEVar5->type).ptr);
    if (!bVar1) {
      SVar9 = slang::syntax::SyntaxNode::sourceRange(&propExpr->super_SyntaxNode);
      pDVar6 = ASTContext::addDiag(&local_78,(DiagCode)0x30007,SVar9);
      pDVar6 = ast::operator<<(pDVar6,(pEVar5->type).ptr);
      goto LAB_004ca54a;
    }
    if ((((local_38->direction).super__Optional_base<slang::ast::ArgumentDirection,_true,_true>.
          _M_payload.super__Optional_payload_base<slang::ast::ArgumentDirection>._M_engaged != true)
        || (1 < (local_38->direction).
                super__Optional_base<slang::ast::ArgumentDirection,_true,_true>._M_payload.
                super__Optional_payload_base<slang::ast::ArgumentDirection>._M_payload._M_value -
                Out)) || (((local_38->super_Symbol).parentScope)->thisSym->kind == Checker)) {
LAB_004ca40a:
      local_80 = pEVar5;
      std::
      variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
      ::operator=((variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
                   *)result,&local_80);
      return true;
    }
    this_00 = (ValueSymbol *)Expression::getSymbolReference(pEVar5,true);
    if ((this_00 != (ValueSymbol *)0x0) && ((this_00->super_Symbol).kind == LocalAssertionVar)) {
      ValueSymbol::addDriver
                (this_00,Procedural,pEVar5,((context->scope).ptr)->thisSym,
                 (bitmask<slang::ast::AssignFlags>)0x40);
      goto LAB_004ca40a;
    }
    SVar9 = pEVar5->sourceRange;
    code.subsystem = Expressions;
    code.code = 7;
    break;
  case UntypedType:
    if (piVar7 != (int *)0x0) {
      iVar2 = Expression::bind((int)piVar7,(sockaddr *)&local_78,0x200);
      local_80 = (Expression *)CONCAT44(extraout_var_01,iVar2);
      std::
      variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
      ::operator=((variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
                   *)result,&local_80);
      bVar1 = Expression::bad((Expression *)CONCAT44(extraout_var_01,iVar2));
      return !bVar1;
    }
    local_78.flags.m_bits = local_78.flags.m_bits | 0x40000;
    goto LAB_004ca4da;
  case SequenceType:
    if (piVar8 != (int *)0x0) {
      iVar2 = AssertionExpr::bind((int)piVar8,(sockaddr *)&local_78,0);
      local_80 = (Expression *)CONCAT44(extraout_var_02,iVar2);
      if (local_80->kind != Invalid) {
        AssertionExpr::requireSequence((AssertionExpr *)local_80,&local_78);
        std::
        variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
        ::operator=((variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
                     *)result,(AssertionExpr **)&local_80);
        return true;
      }
      return false;
    }
    SVar9 = slang::syntax::SyntaxNode::sourceRange(&propExpr->super_SyntaxNode);
    code.subsystem = Expressions;
    code.code = 4;
    break;
  case PropertyType:
LAB_004ca4da:
    iVar2 = AssertionExpr::bind((AssertionExpr *)propExpr,(int)&local_78,(sockaddr *)0x0,0);
    pEVar5 = (Expression *)CONCAT44(extraout_var_03,iVar2);
    local_80 = pEVar5;
    std::
    variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
    ::operator=((variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
                 *)result,(AssertionExpr **)&local_80);
LAB_004ca4f9:
    return pEVar5->kind != Invalid;
  case ErrorType:
    goto LAB_004ca558;
  }
  ASTContext::addDiag(&local_78,code,SVar9);
LAB_004ca558:
  return false;
}

Assistant:

bool AssertionInstanceExpression::checkAssertionArg(const PropertyExprSyntax& propExpr,
                                                    const AssertionPortSymbol& formal,
                                                    const ASTContext& context, ActualArg& result,
                                                    bool isRecursiveProp) {
    auto [seqExpr, regExpr] = decomposePropExpr(propExpr);

    ASTContext ctx = context;
    if (isRecursiveProp && !formal.isLocalVar()) {
        // For every recursive instance of property q in the declaration of property p,
        // each actual argument expression e of the instance must satisfy at least one
        // of the following conditions:
        // 1. e is itself a formal argument of p.
        // 2. No formal argument of p appears in e.
        // 3. e is bound to a local variable formal argument of q.
        if (!regExpr)
            ctx.flags |= ASTFlags::RecursivePropertyArg;
        else {
            auto expr = regExpr;
            while (expr->kind == SyntaxKind::ParenthesizedExpression)
                expr = expr->as<ParenthesizedExpressionSyntax>().expression;

            // This check filters out cases where the entire argument is a formal argument.
            if (expr->kind != SyntaxKind::IdentifierName)
                ctx.flags |= ASTFlags::RecursivePropertyArg;
        }
    }

    auto& type = formal.declaredType.getType();
    switch (type.getCanonicalType().kind) {
        case SymbolKind::UntypedType:
            // Untyped formals allow everything. Bind here just so we notice things like
            // name resolution errors even if the argument ends up being unused in the
            // body of the sequence / property.
            if (regExpr) {
                auto& bound = Expression::bind(*regExpr, ctx, ASTFlags::AllowUnboundedLiteral);
                result = &bound;
                return !bound.bad();
            }
            else {
                ctx.flags |= ASTFlags::AssertionInstanceArgCheck;
                auto& bound = AssertionExpr::bind(propExpr, ctx);
                result = &bound;
                return !bound.bad();
            }
        case SymbolKind::SequenceType: {
            if (!seqExpr) {
                ctx.addDiag(diag::AssertionArgTypeSequence, propExpr.sourceRange());
                return false;
            }

            auto& bound = AssertionExpr::bind(*seqExpr, ctx);
            if (bound.bad())
                return false;

            bound.requireSequence(ctx);
            result = &bound;
            return true;
        }
        case SymbolKind::PropertyType: {
            auto& bound = AssertionExpr::bind(propExpr, ctx);
            result = &bound;
            return !bound.bad();
        }
        case SymbolKind::EventType: {
            auto& bound = TimingControl::bind(propExpr, ctx);
            result = &bound;
            return !bound.bad();
        }
        case SymbolKind::ErrorType:
            return false;
        default:
            break;
    }

    // For all other types, we need a normal expression that
    // is cast compatible with the target type.
    if (!regExpr) {
        ctx.addDiag(diag::AssertionArgNeedsRegExpr, propExpr.sourceRange()) << type;
        return false;
    }

    auto& bound = Expression::bind(*regExpr, ctx);
    if (bound.bad())
        return false;

    if (!type.isCastCompatible(*bound.type)) {
        ctx.addDiag(diag::AssertionArgTypeMismatch, propExpr.sourceRange()) << *bound.type << type;
        return false;
    }

    auto formalParent = formal.getParentScope();
    SLANG_ASSERT(formalParent);

    // Local var formals that are output or inout must bind only to another local var.
    if ((formal.direction == ArgumentDirection::InOut ||
         formal.direction == ArgumentDirection::Out) &&
        formalParent->asSymbol().kind != SymbolKind::Checker) {
        auto sym = bound.getSymbolReference();
        if (!sym || sym->kind != SymbolKind::LocalAssertionVar) {
            ctx.addDiag(diag::AssertionOutputLocalVar, bound.sourceRange);
            return false;
        }

        sym->as<ValueSymbol>().addDriver(DriverKind::Procedural, bound, context.scope->asSymbol(),
                                         AssignFlags::AssertionLocalVarFormalArg);
    }

    result = &bound;
    return true;
}